

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O2

hrgls_Status __thiscall
hrgls::API::SetLogMessageCallback(API *this,LogMessageCallback callback,void *userdata)

{
  API_private *pAVar1;
  hrgls_Status hVar2;
  mutex *pmVar3;
  
  if (this->m_private == (API_private *)0x0) {
    hVar2 = 0x3ee;
  }
  else {
    pmVar3 = &this->m_private->callbackMutex;
    std::mutex::lock(pmVar3);
    pAVar1 = this->m_private;
    pAVar1->callbackHandler = callback;
    pAVar1->callbackUserData = userdata;
    pthread_mutex_unlock((pthread_mutex_t *)pmVar3);
    pmVar3 = &this->m_private->storedMessagesMutex;
    std::mutex::lock(pmVar3);
    std::__cxx11::list<hrgls::Message,_std::allocator<hrgls::Message>_>::clear
              (&this->m_private->storedMessages);
    pthread_mutex_unlock((pthread_mutex_t *)pmVar3);
    hVar2 = 0;
  }
  return hVar2;
}

Assistant:

hrgls_Status API::SetLogMessageCallback(LogMessageCallback callback,
      void *userdata)
  {
      if (!m_private) {
          return hrgls_STATUS_NULL_OBJECT_POINTER;
      }

      // Lock the thread mutices for callback and streaming while we change
      // the state.
      {
        std::lock_guard<std::mutex> lock(m_private->callbackMutex);

        // Set the streaming callback handler.
        m_private->callbackHandler = callback;
        m_private->callbackUserData = userdata;
      }

      // Flush all stored messages.
      std::lock_guard<std::mutex> lock2(m_private->storedMessagesMutex);
      m_private->storedMessages.clear();

      return hrgls_STATUS_OKAY;
  }